

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

bool __thiscall
CommandLineArguments::SetOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  bool bVar1;
  OutputType OVar2;
  size_t sVar3;
  int ac_00;
  SimpleString local_40;
  SimpleString outputType;
  SimpleString local_30;
  
  ac_00 = 0x1ad9dc;
  SimpleString::SimpleString(&local_40,"-o");
  getParameterField((CommandLineArguments *)&outputType,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&local_40);
  sVar3 = SimpleString::size(&outputType);
  if (sVar3 == 0) {
LAB_001a6d0f:
    bVar1 = false;
  }
  else {
    SimpleString::SimpleString(&local_40,"normal");
    bVar1 = operator==(&outputType,&local_40);
    if (bVar1) {
      SimpleString::~SimpleString(&local_40);
      OVar2 = OUTPUT_ECLIPSE;
    }
    else {
      SimpleString::SimpleString(&local_30,"eclipse");
      bVar1 = operator==(&outputType,&local_30);
      SimpleString::~SimpleString(&local_30);
      SimpleString::~SimpleString(&local_40);
      OVar2 = OUTPUT_ECLIPSE;
      if (!bVar1) {
        SimpleString::SimpleString(&local_40,"junit");
        bVar1 = operator==(&outputType,&local_40);
        SimpleString::~SimpleString(&local_40);
        if (bVar1) {
          OVar2 = OUTPUT_JUNIT;
        }
        else {
          SimpleString::SimpleString(&local_40,"teamcity");
          bVar1 = operator==(&outputType,&local_40);
          SimpleString::~SimpleString(&local_40);
          if (!bVar1) goto LAB_001a6d0f;
          OVar2 = OUTPUT_TEAMCITY;
        }
      }
    }
    this->outputType_ = OVar2;
    bVar1 = true;
  }
  SimpleString::~SimpleString(&outputType);
  return bVar1;
}

Assistant:

bool CommandLineArguments::SetOutputType(int ac, const char** av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}